

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl_io.cpp
# Opt level: O2

void __thiscall OPLio::OPLshutup(OPLio *this)

{
  uint channel;
  int iVar1;
  
  channel = 0;
  iVar1 = 0xb0;
  while( true ) {
    if (this->OPLchannels <= channel) break;
    OPLwriteChannel(this,0x40,channel,'?','?');
    OPLwriteChannel(this,0x60,channel,0xff,0xff);
    OPLwriteChannel(this,0x80,channel,'\x0f','\x0f');
    (*this->_vptr_OPLio[4])(this,(ulong)channel / 9,(ulong)(iVar1 + (channel / 9) * -9),0);
    channel = channel + 1;
    iVar1 = iVar1 + 1;
  }
  return;
}

Assistant:

void OPLio::OPLshutup(void)
{
	uint i;

	for(i = 0; i < OPLchannels; i++)
	{
		OPLwriteChannel(0x40, i, 0x3F, 0x3F);	// turn off volume
		OPLwriteChannel(0x60, i, 0xFF, 0xFF);	// the fastest attack, decay
		OPLwriteChannel(0x80, i, 0x0F, 0x0F);	// ... and release
		OPLwriteValue(0xB0, i, 0);		// KEY-OFF
	}
}